

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase50::run(TestCase50 *this)

{
  bool bVar1;
  StringPtr originalText;
  StringPtr originalText_00;
  StringPtr originalText_01;
  StringPtr originalText_02;
  StringPtr originalText_03;
  StringPtr originalText_04;
  StringPtr originalText_05;
  StringPtr originalText_06;
  StringPtr originalText_07;
  StringPtr originalText_08;
  StringPtr originalText_09;
  StringPtr originalText_10;
  StringPtr originalText_11;
  StringPtr originalText_12;
  StringPtr originalText_13;
  StringPtr originalText_14;
  StringPtr originalText_15;
  StringPtr originalText_16;
  StringPtr originalText_17;
  StringPtr originalText_18;
  StringPtr originalText_19;
  StringPtr originalText_20;
  StringPtr originalText_21;
  StringPtr originalText_22;
  StringPtr originalText_23;
  StringPtr originalText_24;
  StringPtr originalText_25;
  StringPtr originalText_26;
  StringPtr originalText_27;
  StringPtr originalText_28;
  StringPtr originalText_29;
  StringPtr originalText_30;
  StringPtr expectedRestringified;
  StringPtr expectedRestringified_00;
  StringPtr expectedRestringified_01;
  StringPtr expectedRestringified_02;
  StringPtr expectedRestringified_03;
  StringPtr expectedRestringified_04;
  StringPtr expectedRestringified_05;
  StringPtr expectedRestringified_06;
  StringPtr expectedRestringified_07;
  StringPtr expectedRestringified_08;
  StringPtr expectedRestringified_09;
  StringPtr expectedRestringified_10;
  StringPtr expectedRestringified_11;
  StringPtr expectedRestringified_12;
  StringPtr expectedRestringified_13;
  StringPtr expectedRestringified_14;
  StringPtr expectedRestringified_15;
  StringPtr expectedRestringified_16;
  StringPtr expectedRestringified_17;
  StringPtr expectedRestringified_18;
  StringPtr expectedRestringified_19;
  StringPtr expectedRestringified_20;
  StringPtr expectedRestringified_21;
  StringPtr expectedRestringified_22;
  StringPtr expectedRestringified_23;
  StringPtr expectedRestringified_24;
  StringPtr expectedRestringified_25;
  StringPtr expectedRestringified_26;
  StringPtr expectedRestringified_27;
  StringPtr expectedRestringified_28;
  StringPtr expectedRestringified_29;
  StringPtr expectedRestringified_30;
  Fault f;
  Url url;
  ArrayPtr<const_kj::StringPtr> local_9f0;
  ArrayPtr<kj::String> local_9e0;
  Url local_9d0;
  Url local_8f0;
  Url local_810;
  Url local_730;
  Url local_650;
  Url local_570;
  Url local_490;
  Url local_3b0;
  Url local_2d0;
  Url local_1f0;
  Url local_110;
  
  originalText.content.size_ = 0x16;
  originalText.content.ptr = "https://capnproto.org";
  expectedRestringified.content.size_ = 1;
  expectedRestringified.content.ptr = "";
  parseAndCheck(&url,originalText,expectedRestringified,(Options)0x1);
  f.exception = (Exception *)anon_var_dwarf_1edd28;
  bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x35,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x36,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  f.exception = (Exception *)0x359257;
  bVar1 = String::operator==(&url.host,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x37,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  if (url.path.builder.pos != url.path.builder.ptr && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x38,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
               (char (*) [37])"failed: expected url.path == nullptr");
  }
  if ((url.hasTrailingSlash & _::Debug::minSeverity < 3) != 0) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((url.query.builder.pos != url.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x3a,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if ((url.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x3b,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
               (char (*) [41])"failed: expected url.fragment == nullptr");
  }
  Url::~Url(&url);
  originalText_00.content.size_ = 0x19;
  originalText_00.content.ptr = "https://capnproto.org:80";
  expectedRestringified_00.content.size_ = 1;
  expectedRestringified_00.content.ptr = "";
  parseAndCheck(&url,originalText_00,expectedRestringified_00,(Options)0x1);
  f.exception = (Exception *)anon_var_dwarf_1edd28;
  bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x40,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  f.exception = (Exception *)0x34d197;
  bVar1 = String::operator==(&url.host,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x42,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org:80\\\"\"",
               (char (*) [48])"failed: expected url.host == \"capnproto.org:80\"");
  }
  if (url.path.builder.pos != url.path.builder.ptr && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x43,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
               (char (*) [37])"failed: expected url.path == nullptr");
  }
  if ((url.hasTrailingSlash & _::Debug::minSeverity < 3) != 0) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x44,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((url.query.builder.pos != url.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x45,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if ((url.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x46,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
               (char (*) [41])"failed: expected url.fragment == nullptr");
  }
  Url::~Url(&url);
  originalText_01.content.size_ = 0x17;
  originalText_01.content.ptr = "https://capnproto.org/";
  expectedRestringified_01.content.size_ = 1;
  expectedRestringified_01.content.ptr = "";
  parseAndCheck(&url,originalText_01,expectedRestringified_01,(Options)0x1);
  f.exception = (Exception *)anon_var_dwarf_1edd28;
  bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x4b,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x4c,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  f.exception = (Exception *)0x359257;
  bVar1 = String::operator==(&url.host,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x4d,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  if (url.path.builder.pos != url.path.builder.ptr && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x4e,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
               (char (*) [37])"failed: expected url.path == nullptr");
  }
  if (_::Debug::minSeverity < 3 && url.hasTrailingSlash == false) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x4f,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
               (char (*) [38])"failed: expected url.hasTrailingSlash");
  }
  if ((url.query.builder.pos != url.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x50,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if ((url.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x51,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
               (char (*) [41])"failed: expected url.fragment == nullptr");
  }
  Url::~Url(&url);
  originalText_02.content.size_ = 0x1e;
  originalText_02.content.ptr = "https://capnproto.org/foo/bar";
  expectedRestringified_02.content.size_ = 1;
  expectedRestringified_02.content.ptr = "";
  parseAndCheck(&url,originalText_02,expectedRestringified_02,(Options)0x1);
  f.exception = (Exception *)anon_var_dwarf_1edd28;
  bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x56,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x57,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  f.exception = (Exception *)0x359257;
  bVar1 = String::operator==(&url.host,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x58,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  local_9e0.size_ = ((long)url.path.builder.pos - (long)url.path.builder.ptr) / 0x18;
  local_9e0.ptr = url.path.builder.ptr;
  f.exception = (Exception *)0x357ec7;
  local_9f0.size_ = 2;
  local_9f0.ptr = (StringPtr *)&f;
  bVar1 = ArrayPtr<kj::String>::operator==(&local_9e0,&local_9f0);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[83]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x59,ERROR,
               "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
               ,(char (*) [83])
                "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
              );
  }
  if ((url.hasTrailingSlash & _::Debug::minSeverity < 3) != 0) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x5a,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if (url.query.builder.pos != url.query.builder.ptr && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x5b,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if ((url.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x5c,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
               (char (*) [41])"failed: expected url.fragment == nullptr");
  }
  Url::~Url(&url);
  originalText_03.content.size_ = 0x1f;
  originalText_03.content.ptr = "https://capnproto.org/foo/bar/";
  expectedRestringified_03.content.size_ = 1;
  expectedRestringified_03.content.ptr = "";
  parseAndCheck(&url,originalText_03,expectedRestringified_03,(Options)0x1);
  f.exception = (Exception *)anon_var_dwarf_1edd28;
  bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x61,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x62,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  f.exception = (Exception *)0x359257;
  bVar1 = String::operator==(&url.host,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,99,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  local_9e0.size_ = ((long)url.path.builder.pos - (long)url.path.builder.ptr) / 0x18;
  local_9e0.ptr = url.path.builder.ptr;
  f.exception = (Exception *)0x357ec7;
  local_9f0.size_ = 2;
  local_9f0.ptr = (StringPtr *)&f;
  bVar1 = ArrayPtr<kj::String>::operator==(&local_9e0,&local_9f0);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[83]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,100,ERROR,
               "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
               ,(char (*) [83])
                "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
              );
  }
  if (_::Debug::minSeverity < 3 && url.hasTrailingSlash == false) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x65,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
               (char (*) [38])"failed: expected url.hasTrailingSlash");
  }
  if (url.query.builder.pos != url.query.builder.ptr && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x66,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if ((url.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x67,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
               (char (*) [41])"failed: expected url.fragment == nullptr");
  }
  Url::~Url(&url);
  originalText_04.content.size_ = 0x33;
  originalText_04.content.ptr = "https://capnproto.org/foo/bar?baz=qux&corge#garply";
  expectedRestringified_04.content.size_ = 1;
  expectedRestringified_04.content.ptr = "";
  parseAndCheck(&url,originalText_04,expectedRestringified_04,(Options)0x1);
  f.exception = (Exception *)anon_var_dwarf_1edd28;
  bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x6c,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x6d,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  f.exception = (Exception *)0x359257;
  bVar1 = String::operator==(&url.host,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x6e,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  local_9e0.size_ = ((long)url.path.builder.pos - (long)url.path.builder.ptr) / 0x18;
  local_9e0.ptr = url.path.builder.ptr;
  f.exception = (Exception *)0x357ec7;
  local_9f0.size_ = 2;
  local_9f0.ptr = (StringPtr *)&f;
  bVar1 = ArrayPtr<kj::String>::operator==(&local_9e0,&local_9f0);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[83]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x6f,ERROR,
               "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
               ,(char (*) [83])
                "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
              );
  }
  if ((url.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x70,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((long)url.query.builder.pos - (long)url.query.builder.ptr != 0x60) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x71,FAILED,"url.query.size() == 2","");
    _::Debug::Fault::fatal(&f);
  }
  f.exception = (Exception *)0x3301d1;
  bVar1 = String::operator==(&(url.query.builder.ptr)->name,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x72,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
               (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
  }
  f.exception = (Exception *)0x33760d;
  bVar1 = String::operator==(&(url.query.builder.ptr)->value,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x73,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux\\\"\"",
               (char (*) [45])"failed: expected url.query[0].value == \"qux\"");
  }
  f.exception = (Exception *)0x33b65b;
  bVar1 = String::operator==(&url.query.builder.ptr[1].name,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x74,ERROR,"\"failed: expected \" \"url.query[1].name == \\\"corge\\\"\"",
               (char (*) [46])"failed: expected url.query[1].name == \"corge\"");
  }
  if ((1 < url.query.builder.ptr[1].value.content.size_) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x75,ERROR,"\"failed: expected \" \"url.query[1].value == nullptr\"",
               (char (*) [47])"failed: expected url.query[1].value == nullptr");
  }
  if (url.fragment.ptr.isSet == false) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x76,FAILED,"url.fragment != nullptr","");
    _::Debug::Fault::fatal(&f);
  }
  f.exception = (Exception *)0x34d928;
  bVar1 = String::operator==(&url.fragment.ptr.field_1.value,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x76,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
               (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
  }
  Url::~Url(&url);
  originalText_05.content.size_ = 0x34;
  originalText_05.content.ptr = "https://capnproto.org/foo/bar?baz=qux&corge=#garply";
  expectedRestringified_05.content.size_ = 1;
  expectedRestringified_05.content.ptr = "";
  parseAndCheck(&url,originalText_05,expectedRestringified_05,(Options)0x1);
  f.exception = (Exception *)anon_var_dwarf_1edd28;
  bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x7b,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x7c,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  f.exception = (Exception *)0x359257;
  bVar1 = String::operator==(&url.host,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x7d,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  local_9e0.size_ = ((long)url.path.builder.pos - (long)url.path.builder.ptr) / 0x18;
  local_9e0.ptr = url.path.builder.ptr;
  f.exception = (Exception *)0x357ec7;
  local_9f0.size_ = 2;
  local_9f0.ptr = (StringPtr *)&f;
  bVar1 = ArrayPtr<kj::String>::operator==(&local_9e0,&local_9f0);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[83]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x7e,ERROR,
               "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
               ,(char (*) [83])
                "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
              );
  }
  if ((url.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x7f,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((long)url.query.builder.pos - (long)url.query.builder.ptr != 0x60) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x80,FAILED,"url.query.size() == 2","");
    _::Debug::Fault::fatal(&f);
  }
  f.exception = (Exception *)0x3301d1;
  bVar1 = String::operator==(&(url.query.builder.ptr)->name,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x81,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
               (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
  }
  f.exception = (Exception *)0x33760d;
  bVar1 = String::operator==(&(url.query.builder.ptr)->value,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x82,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux\\\"\"",
               (char (*) [45])"failed: expected url.query[0].value == \"qux\"");
  }
  f.exception = (Exception *)0x33b65b;
  bVar1 = String::operator==(&url.query.builder.ptr[1].name,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x83,ERROR,"\"failed: expected \" \"url.query[1].name == \\\"corge\\\"\"",
               (char (*) [46])"failed: expected url.query[1].name == \"corge\"");
  }
  if ((1 < url.query.builder.ptr[1].value.content.size_) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x84,ERROR,"\"failed: expected \" \"url.query[1].value == nullptr\"",
               (char (*) [47])"failed: expected url.query[1].value == nullptr");
  }
  if (url.fragment.ptr.isSet == false) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x85,FAILED,"url.fragment != nullptr","");
    _::Debug::Fault::fatal(&f);
  }
  f.exception = (Exception *)0x34d928;
  bVar1 = String::operator==(&url.fragment.ptr.field_1.value,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x85,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
               (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
  }
  Url::~Url(&url);
  originalText_06.content.size_ = 0x37;
  originalText_06.content.ptr = "https://capnproto.org/foo/bar?baz=&corge=grault#garply";
  expectedRestringified_06.content.size_ = 1;
  expectedRestringified_06.content.ptr = "";
  parseAndCheck(&url,originalText_06,expectedRestringified_06,(Options)0x1);
  f.exception = (Exception *)anon_var_dwarf_1edd28;
  bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x8a,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x8b,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  f.exception = (Exception *)0x359257;
  bVar1 = String::operator==(&url.host,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x8c,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  local_9e0.size_ = ((long)url.path.builder.pos - (long)url.path.builder.ptr) / 0x18;
  local_9e0.ptr = url.path.builder.ptr;
  f.exception = (Exception *)0x357ec7;
  local_9f0.size_ = 2;
  local_9f0.ptr = (StringPtr *)&f;
  bVar1 = ArrayPtr<kj::String>::operator==(&local_9e0,&local_9f0);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[83]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x8d,ERROR,
               "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
               ,(char (*) [83])
                "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
              );
  }
  if ((url.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x8e,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((long)url.query.builder.pos - (long)url.query.builder.ptr != 0x60) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x8f,FAILED,"url.query.size() == 2","");
    _::Debug::Fault::fatal(&f);
  }
  f.exception = (Exception *)0x3301d1;
  bVar1 = String::operator==(&(url.query.builder.ptr)->name,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x90,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
               (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
  }
  f.exception = (Exception *)0x33812f;
  bVar1 = String::operator==(&(url.query.builder.ptr)->value,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x91,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"\\\"\"",
               (char (*) [42])"failed: expected url.query[0].value == \"\"");
  }
  f.exception = (Exception *)0x33b65b;
  bVar1 = String::operator==(&url.query.builder.ptr[1].name,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x92,ERROR,"\"failed: expected \" \"url.query[1].name == \\\"corge\\\"\"",
               (char (*) [46])"failed: expected url.query[1].name == \"corge\"");
  }
  f.exception = (Exception *)0x3557a9;
  bVar1 = String::operator==(&url.query.builder.ptr[1].value,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x93,ERROR,"\"failed: expected \" \"url.query[1].value == \\\"grault\\\"\"",
               (char (*) [48])"failed: expected url.query[1].value == \"grault\"");
  }
  if (url.fragment.ptr.isSet == false) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x94,FAILED,"url.fragment != nullptr","");
    _::Debug::Fault::fatal(&f);
  }
  f.exception = (Exception *)0x34d928;
  bVar1 = String::operator==(&url.fragment.ptr.field_1.value,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x94,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
               (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
  }
  Url::~Url(&url);
  originalText_07.content.size_ = 0x3b;
  originalText_07.content.ptr = "https://capnproto.org/foo/bar/?baz=qux&corge=grault#garply";
  expectedRestringified_07.content.size_ = 1;
  expectedRestringified_07.content.ptr = "";
  parseAndCheck(&url,originalText_07,expectedRestringified_07,(Options)0x1);
  f.exception = (Exception *)anon_var_dwarf_1edd28;
  bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x99,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x9a,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  f.exception = (Exception *)0x359257;
  bVar1 = String::operator==(&url.host,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x9b,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  local_9e0.size_ = ((long)url.path.builder.pos - (long)url.path.builder.ptr) / 0x18;
  local_9e0.ptr = url.path.builder.ptr;
  f.exception = (Exception *)0x357ec7;
  local_9f0.size_ = 2;
  local_9f0.ptr = (StringPtr *)&f;
  bVar1 = ArrayPtr<kj::String>::operator==(&local_9e0,&local_9f0);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[83]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x9c,ERROR,
               "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
               ,(char (*) [83])
                "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
              );
  }
  if ((url.hasTrailingSlash == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x9d,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
               (char (*) [38])"failed: expected url.hasTrailingSlash");
  }
  if ((long)url.query.builder.pos - (long)url.query.builder.ptr != 0x60) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x9e,FAILED,"url.query.size() == 2","");
    _::Debug::Fault::fatal(&f);
  }
  f.exception = (Exception *)0x3301d1;
  bVar1 = String::operator==(&(url.query.builder.ptr)->name,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x9f,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
               (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
  }
  f.exception = (Exception *)0x33760d;
  bVar1 = String::operator==(&(url.query.builder.ptr)->value,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xa0,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux\\\"\"",
               (char (*) [45])"failed: expected url.query[0].value == \"qux\"");
  }
  f.exception = (Exception *)0x33b65b;
  bVar1 = String::operator==(&url.query.builder.ptr[1].name,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xa1,ERROR,"\"failed: expected \" \"url.query[1].name == \\\"corge\\\"\"",
               (char (*) [46])"failed: expected url.query[1].name == \"corge\"");
  }
  f.exception = (Exception *)0x3557a9;
  bVar1 = String::operator==(&url.query.builder.ptr[1].value,(StringPtr *)&f);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xa2,ERROR,"\"failed: expected \" \"url.query[1].value == \\\"grault\\\"\"",
               (char (*) [48])"failed: expected url.query[1].value == \"grault\"");
  }
  if (url.fragment.ptr.isSet != false) {
    f.exception = (Exception *)0x34d928;
    bVar1 = String::operator==(&url.fragment.ptr.field_1.value,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xa3,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                 (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
    }
    Url::~Url(&url);
    originalText_08.content.size_ = 0x2d;
    originalText_08.content.ptr = "https://capnproto.org/foo/bar?baz=qux#garply";
    expectedRestringified_08.content.size_ = 1;
    expectedRestringified_08.content.ptr = "";
    parseAndCheck(&url,originalText_08,expectedRestringified_08,(Options)0x1);
    f.exception = (Exception *)anon_var_dwarf_1edd28;
    bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xa8,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
    }
    if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xa9,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
    }
    f.exception = (Exception *)0x359257;
    bVar1 = String::operator==(&url.host,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xaa,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
    }
    local_9e0.size_ = ((long)url.path.builder.pos - (long)url.path.builder.ptr) / 0x18;
    local_9e0.ptr = url.path.builder.ptr;
    f.exception = (Exception *)0x357ec7;
    local_9f0.size_ = 2;
    local_9f0.ptr = (StringPtr *)&f;
    bVar1 = ArrayPtr<kj::String>::operator==(&local_9e0,&local_9f0);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xab,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
    }
    if ((url.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xac,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                 (char (*) [39])"failed: expected !url.hasTrailingSlash");
    }
    if ((long)url.query.builder.pos - (long)url.query.builder.ptr != 0x30) {
      _::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xad,FAILED,"url.query.size() == 1","");
      _::Debug::Fault::fatal(&f);
    }
    f.exception = (Exception *)0x3301d1;
    bVar1 = String::operator==(&(url.query.builder.ptr)->name,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xae,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
                 (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
    }
    f.exception = (Exception *)0x33760d;
    bVar1 = String::operator==(&(url.query.builder.ptr)->value,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xaf,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux\\\"\"",
                 (char (*) [45])"failed: expected url.query[0].value == \"qux\"");
    }
    if (url.fragment.ptr.isSet == false) {
      _::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xb0,FAILED,"url.fragment != nullptr","");
      _::Debug::Fault::fatal(&f);
    }
    f.exception = (Exception *)0x34d928;
    bVar1 = String::operator==(&url.fragment.ptr.field_1.value,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xb0,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                 (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
    }
    Url::~Url(&url);
    originalText_09.content.size_ = 0x2d;
    originalText_09.content.ptr = "https://capnproto.org/foo?bar%20baz=qux+quux";
    expectedRestringified_09.content.size_ = 0x2b;
    expectedRestringified_09.content.ptr = "https://capnproto.org/foo?bar+baz=qux+quux";
    parseAndCheck(&url,originalText_09,expectedRestringified_09,(Options)0x1);
    if ((long)url.query.builder.pos - (long)url.query.builder.ptr != 0x30) {
      _::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xb6,FAILED,"url.query.size() == 1","");
      _::Debug::Fault::fatal(&f);
    }
    f.exception = (Exception *)0x3301cd;
    bVar1 = String::operator==(&(url.query.builder.ptr)->name,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xb7,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"bar baz\\\"\"",
                 (char (*) [48])"failed: expected url.query[0].name == \"bar baz\"");
    }
    f.exception = (Exception *)anon_var_dwarf_1ee120;
    bVar1 = String::operator==(&(url.query.builder.ptr)->value,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[50]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xb8,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux quux\\\"\"",
                 (char (*) [50])"failed: expected url.query[0].value == \"qux quux\"");
    }
    Url::~Url(&url);
    originalText_10.content.size_ = 0x25;
    originalText_10.content.ptr = "https://capnproto.org/foo/bar#garply";
    expectedRestringified_10.content.size_ = 1;
    expectedRestringified_10.content.ptr = "";
    parseAndCheck(&url,originalText_10,expectedRestringified_10,(Options)0x1);
    f.exception = (Exception *)anon_var_dwarf_1edd28;
    bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xbd,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
    }
    if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xbe,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
    }
    f.exception = (Exception *)0x359257;
    bVar1 = String::operator==(&url.host,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xbf,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
    }
    local_9e0.size_ = ((long)url.path.builder.pos - (long)url.path.builder.ptr) / 0x18;
    local_9e0.ptr = url.path.builder.ptr;
    f.exception = (Exception *)0x357ec7;
    local_9f0.size_ = 2;
    local_9f0.ptr = (StringPtr *)&f;
    bVar1 = ArrayPtr<kj::String>::operator==(&local_9e0,&local_9f0);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xc0,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
    }
    if ((url.hasTrailingSlash & _::Debug::minSeverity < 3) != 0) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xc1,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                 (char (*) [39])"failed: expected !url.hasTrailingSlash");
    }
    if ((url.query.builder.pos != url.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xc2,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                 (char (*) [38])"failed: expected url.query == nullptr");
    }
    if (url.fragment.ptr.isSet == false) {
      _::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xc3,FAILED,"url.fragment != nullptr","");
      _::Debug::Fault::fatal(&f);
    }
    f.exception = (Exception *)0x34d928;
    bVar1 = String::operator==(&url.fragment.ptr.field_1.value,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xc3,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                 (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
    }
    Url::~Url(&url);
    originalText_11.content.size_ = 0x26;
    originalText_11.content.ptr = "https://capnproto.org/foo/bar/#garply";
    expectedRestringified_11.content.size_ = 1;
    expectedRestringified_11.content.ptr = "";
    parseAndCheck(&url,originalText_11,expectedRestringified_11,(Options)0x1);
    f.exception = (Exception *)anon_var_dwarf_1edd28;
    bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,200,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
    }
    if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xc9,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
    }
    f.exception = (Exception *)0x359257;
    bVar1 = String::operator==(&url.host,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xca,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
    }
    local_9e0.size_ = ((long)url.path.builder.pos - (long)url.path.builder.ptr) / 0x18;
    local_9e0.ptr = url.path.builder.ptr;
    f.exception = (Exception *)0x357ec7;
    local_9f0.size_ = 2;
    local_9f0.ptr = (StringPtr *)&f;
    bVar1 = ArrayPtr<kj::String>::operator==(&local_9e0,&local_9f0);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xcb,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
    }
    if (_::Debug::minSeverity < 3 && url.hasTrailingSlash == false) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xcc,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
                 (char (*) [38])"failed: expected url.hasTrailingSlash");
    }
    if ((url.query.builder.pos != url.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xcd,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                 (char (*) [38])"failed: expected url.query == nullptr");
    }
    if (url.fragment.ptr.isSet == false) {
      _::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xce,FAILED,"url.fragment != nullptr","");
      _::Debug::Fault::fatal(&f);
    }
    f.exception = (Exception *)0x34d928;
    bVar1 = String::operator==(&url.fragment.ptr.field_1.value,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xce,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                 (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
    }
    Url::~Url(&url);
    originalText_12.content.size_ = 0x1d;
    originalText_12.content.ptr = "https://capnproto.org#garply";
    expectedRestringified_12.content.size_ = 1;
    expectedRestringified_12.content.ptr = "";
    parseAndCheck(&url,originalText_12,expectedRestringified_12,(Options)0x1);
    f.exception = (Exception *)anon_var_dwarf_1edd28;
    bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xd3,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                 (char (*) [39])"failed: expected url.scheme == \"https\"");
    }
    if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xd4,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                 (char (*) [41])"failed: expected url.userInfo == nullptr");
    }
    f.exception = (Exception *)0x359257;
    bVar1 = String::operator==(&url.host,(StringPtr *)&f);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xd5,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                 (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
    }
    if (url.path.builder.pos != url.path.builder.ptr && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xd6,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
                 (char (*) [37])"failed: expected url.path == nullptr");
    }
    if ((url.hasTrailingSlash & _::Debug::minSeverity < 3) != 0) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xd7,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                 (char (*) [39])"failed: expected !url.hasTrailingSlash");
    }
    if ((url.query.builder.pos != url.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xd8,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                 (char (*) [38])"failed: expected url.query == nullptr");
    }
    if (url.fragment.ptr.isSet != false) {
      f.exception = (Exception *)0x34d928;
      bVar1 = String::operator==(&url.fragment.ptr.field_1.value,(StringPtr *)&f);
      if (!bVar1 && _::Debug::minSeverity < 3) {
        _::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xd9,ERROR,
                   "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                   (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
      }
      Url::~Url(&url);
      originalText_13.content.size_ = 0x1e;
      originalText_13.content.ptr = "https://capnproto.org/#garply";
      expectedRestringified_13.content.size_ = 1;
      expectedRestringified_13.content.ptr = "";
      parseAndCheck(&url,originalText_13,expectedRestringified_13,(Options)0x1);
      f.exception = (Exception *)anon_var_dwarf_1edd28;
      bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
      if (!bVar1 && _::Debug::minSeverity < 3) {
        _::Debug::log<char_const(&)[39]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xde,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                   (char (*) [39])"failed: expected url.scheme == \"https\"");
      }
      if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
        _::Debug::log<char_const(&)[41]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xdf,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                   (char (*) [41])"failed: expected url.userInfo == nullptr");
      }
      f.exception = (Exception *)0x359257;
      bVar1 = String::operator==(&url.host,(StringPtr *)&f);
      if (!bVar1 && _::Debug::minSeverity < 3) {
        _::Debug::log<char_const(&)[45]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xe0,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                   (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      }
      if (url.path.builder.pos != url.path.builder.ptr && _::Debug::minSeverity < 3) {
        _::Debug::log<char_const(&)[37]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xe1,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
                   (char (*) [37])"failed: expected url.path == nullptr");
      }
      if (_::Debug::minSeverity < 3 && url.hasTrailingSlash == false) {
        _::Debug::log<char_const(&)[38]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xe2,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
                   (char (*) [38])"failed: expected url.hasTrailingSlash");
      }
      if ((url.query.builder.pos != url.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
        _::Debug::log<char_const(&)[38]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xe3,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                   (char (*) [38])"failed: expected url.query == nullptr");
      }
      if (url.fragment.ptr.isSet == false) {
        _::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xe4,FAILED,"url.fragment != nullptr","");
        _::Debug::Fault::fatal(&f);
      }
      f.exception = (Exception *)0x34d928;
      bVar1 = String::operator==(&url.fragment.ptr.field_1.value,(StringPtr *)&f);
      if (!bVar1 && _::Debug::minSeverity < 3) {
        _::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xe4,ERROR,
                   "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
                   (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
      }
      Url::~Url(&url);
      originalText_14.content.size_ = 0x1a;
      originalText_14.content.ptr = "https://foo@capnproto.org";
      expectedRestringified_14.content.size_ = 1;
      expectedRestringified_14.content.ptr = "";
      parseAndCheck(&url,originalText_14,expectedRestringified_14,(Options)0x1);
      f.exception = (Exception *)anon_var_dwarf_1edd28;
      bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
      if (!bVar1 && _::Debug::minSeverity < 3) {
        _::Debug::log<char_const(&)[39]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xe9,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                   (char (*) [39])"failed: expected url.scheme == \"https\"");
      }
      if (url.userInfo.ptr.isSet == false) {
        _::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xea,FAILED,"url.userInfo != nullptr","");
        _::Debug::Fault::fatal(&f);
      }
      f.exception = (Exception *)0x357ec7;
      bVar1 = String::operator==(&url.userInfo.ptr.field_1.value.username,(StringPtr *)&f);
      if (!bVar1 && _::Debug::minSeverity < 3) {
        _::Debug::log<char_const(&)[40]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xeb,ERROR,"\"failed: expected \" \"user.username == \\\"foo\\\"\"",
                   (char (*) [40])"failed: expected user.username == \"foo\"");
      }
      if ((url.userInfo.ptr.field_1.value.password.ptr.isSet == true) && (_::Debug::minSeverity < 3)
         ) {
        _::Debug::log<char_const(&)[42]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xec,ERROR,"\"failed: expected \" \"user.password == nullptr\"",
                   (char (*) [42])"failed: expected user.password == nullptr");
      }
      f.exception = (Exception *)0x359257;
      bVar1 = String::operator==(&url.host,(StringPtr *)&f);
      if (!bVar1 && _::Debug::minSeverity < 3) {
        _::Debug::log<char_const(&)[45]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xed,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                   (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
      }
      if (url.path.builder.pos != url.path.builder.ptr && _::Debug::minSeverity < 3) {
        _::Debug::log<char_const(&)[37]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xee,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
                   (char (*) [37])"failed: expected url.path == nullptr");
      }
      if ((url.hasTrailingSlash & _::Debug::minSeverity < 3) != 0) {
        _::Debug::log<char_const(&)[39]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xef,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                   (char (*) [39])"failed: expected !url.hasTrailingSlash");
      }
      if ((url.query.builder.pos != url.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
        _::Debug::log<char_const(&)[38]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xf0,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                   (char (*) [38])"failed: expected url.query == nullptr");
      }
      if ((url.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
        _::Debug::log<char_const(&)[41]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xf1,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
                   (char (*) [41])"failed: expected url.fragment == nullptr");
      }
      Url::~Url(&url);
      originalText_15.content.size_ = 0x23;
      originalText_15.content.ptr = "https://$foo&:12+,34@capnproto.org";
      expectedRestringified_15.content.size_ = 1;
      expectedRestringified_15.content.ptr = "";
      parseAndCheck(&url,originalText_15,expectedRestringified_15,(Options)0x1);
      f.exception = (Exception *)anon_var_dwarf_1edd28;
      bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
      if (!bVar1 && _::Debug::minSeverity < 3) {
        _::Debug::log<char_const(&)[39]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xf6,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                   (char (*) [39])"failed: expected url.scheme == \"https\"");
      }
      if (url.userInfo.ptr.isSet != false) {
        f.exception = (Exception *)anon_var_dwarf_1ee200;
        bVar1 = String::operator==(&url.userInfo.ptr.field_1.value.username,(StringPtr *)&f);
        if (!bVar1 && _::Debug::minSeverity < 3) {
          _::Debug::log<char_const(&)[42]>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                     ,0xf8,ERROR,"\"failed: expected \" \"user.username == \\\"$foo&\\\"\"",
                     (char (*) [42])"failed: expected user.username == \"$foo&\"");
        }
        if (url.userInfo.ptr.field_1.value.password.ptr.isSet != false) {
          f.exception = (Exception *)anon_var_dwarf_1ee228;
          bVar1 = String::operator==(&url.userInfo.ptr.field_1.value.password.ptr.field_1.value,
                                     (StringPtr *)&f);
          if (!bVar1 && _::Debug::minSeverity < 3) {
            _::Debug::log<char_const(&)[62]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0xf9,ERROR,
                       "\"failed: expected \" \"KJ_ASSERT_NONNULL(user.password) == \\\"12+,34\\\"\""
                       ,(char (*) [62])
                        "failed: expected KJ_ASSERT_NONNULL(user.password) == \"12+,34\"");
          }
          f.exception = (Exception *)0x359257;
          bVar1 = String::operator==(&url.host,(StringPtr *)&f);
          if (!bVar1 && _::Debug::minSeverity < 3) {
            _::Debug::log<char_const(&)[45]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0xfa,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
                       (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
          }
          if (url.path.builder.pos != url.path.builder.ptr && _::Debug::minSeverity < 3) {
            _::Debug::log<char_const(&)[37]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0xfb,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
                       (char (*) [37])"failed: expected url.path == nullptr");
          }
          if ((url.hasTrailingSlash & _::Debug::minSeverity < 3) != 0) {
            _::Debug::log<char_const(&)[39]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0xfc,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                       (char (*) [39])"failed: expected !url.hasTrailingSlash");
          }
          if ((url.query.builder.pos != url.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
            _::Debug::log<char_const(&)[38]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0xfd,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                       (char (*) [38])"failed: expected url.query == nullptr");
          }
          if ((url.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
            _::Debug::log<char_const(&)[41]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0xfe,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
                       (char (*) [41])"failed: expected url.fragment == nullptr");
          }
          Url::~Url(&url);
          originalText_16.content.size_ = 0x20;
          originalText_16.content.ptr = "https://[2001:db8::1234]:80/foo";
          expectedRestringified_16.content.size_ = 1;
          expectedRestringified_16.content.ptr = "";
          parseAndCheck(&url,originalText_16,expectedRestringified_16,(Options)0x1);
          f.exception = (Exception *)anon_var_dwarf_1edd28;
          bVar1 = String::operator==(&url.scheme,(StringPtr *)&f);
          if (!bVar1 && _::Debug::minSeverity < 3) {
            _::Debug::log<char_const(&)[39]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0x103,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
                       (char (*) [39])"failed: expected url.scheme == \"https\"");
          }
          if ((url.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
            _::Debug::log<char_const(&)[41]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0x104,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
                       (char (*) [41])"failed: expected url.userInfo == nullptr");
          }
          f.exception = (Exception *)anon_var_dwarf_1ee275;
          bVar1 = String::operator==(&url.host,(StringPtr *)&f);
          if (!bVar1 && _::Debug::minSeverity < 3) {
            _::Debug::log<char_const(&)[51]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0x105,ERROR,
                       "\"failed: expected \" \"url.host == \\\"[2001:db8::1234]:80\\\"\"",
                       (char (*) [51])"failed: expected url.host == \"[2001:db8::1234]:80\"");
          }
          f.exception = (Exception *)url.path.builder.ptr;
          local_9f0.ptr = (StringPtr *)0x357ec7;
          local_9f0.size_ = 4;
          local_9e0.size_ = 1;
          local_9e0.ptr = (String *)&local_9f0;
          bVar1 = ArrayPtr<kj::String>::operator==
                            ((ArrayPtr<kj::String> *)&f,(ArrayPtr<const_kj::StringPtr> *)&local_9e0)
          ;
          if (!bVar1 && _::Debug::minSeverity < 3) {
            _::Debug::log<char_const(&)[76]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0x106,ERROR,
                       "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\"})\""
                       ,(char (*) [76])
                        "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\"})"
                      );
          }
          if ((url.hasTrailingSlash & _::Debug::minSeverity < 3) != 0) {
            _::Debug::log<char_const(&)[39]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0x107,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
                       (char (*) [39])"failed: expected !url.hasTrailingSlash");
          }
          if (url.query.builder.pos != url.query.builder.ptr && _::Debug::minSeverity < 3) {
            _::Debug::log<char_const(&)[38]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0x108,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
                       (char (*) [38])"failed: expected url.query == nullptr");
          }
          if ((url.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
            _::Debug::log<char_const(&)[41]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0x109,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
                       (char (*) [41])"failed: expected url.fragment == nullptr");
          }
          Url::~Url(&url);
          originalText_17.content.size_ = 0x24;
          originalText_17.content.ptr = "https://capnproto.org/foo%2Fbar/baz";
          expectedRestringified_17.content.size_ = 1;
          expectedRestringified_17.content.ptr = "";
          parseAndCheck(&url,originalText_17,expectedRestringified_17,(Options)0x1);
          local_9e0.size_ = ((long)url.path.builder.pos - (long)url.path.builder.ptr) / 0x18;
          local_9e0.ptr = url.path.builder.ptr;
          f.exception = (Exception *)0x344716;
          local_9f0.size_ = 2;
          local_9f0.ptr = (StringPtr *)&f;
          bVar1 = ArrayPtr<kj::String>::operator==(&local_9e0,&local_9f0);
          if (!bVar1 && _::Debug::minSeverity < 3) {
            _::Debug::log<char_const(&)[87]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0x10e,ERROR,
                       "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo/bar\\\", \\\"baz\\\"})\""
                       ,(char (*) [87])
                        "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo/bar\", \"baz\"})"
                      );
          }
          Url::~Url(&url);
          originalText_18.content.size_ = 0x1f;
          originalText_18.content.ptr = "https://capnproto.org/foo/bar?";
          expectedRestringified_18.content.size_ = 0x1e;
          expectedRestringified_18.content.ptr = "https://capnproto.org/foo/bar";
          parseAndCheck(&local_110,originalText_18,expectedRestringified_18,(Options)0x1);
          Url::~Url(&local_110);
          originalText_19.content.size_ = 0x20;
          originalText_19.content.ptr = "https://capnproto.org/foo/bar?#";
          expectedRestringified_19.content.size_ = 0x1f;
          expectedRestringified_19.content.ptr = "https://capnproto.org/foo/bar#";
          parseAndCheck(&local_1f0,originalText_19,expectedRestringified_19,(Options)0x1);
          Url::~Url(&local_1f0);
          originalText_20.content.size_ = 0x1f;
          originalText_20.content.ptr = "https://capnproto.org/foo/bar#";
          expectedRestringified_20.content.size_ = 1;
          expectedRestringified_20.content.ptr = "";
          parseAndCheck(&local_2d0,originalText_20,expectedRestringified_20,(Options)0x1);
          Url::~Url(&local_2d0);
          originalText_21.content.size_ = 0x1d;
          originalText_21.content.ptr = "hTtP://capNprotO.org/fOo/bAr";
          expectedRestringified_21.content.size_ = 0x1d;
          expectedRestringified_21.content.ptr = "http://capnproto.org/fOo/bAr";
          parseAndCheck(&local_3b0,originalText_21,expectedRestringified_21,(Options)0x1);
          Url::~Url(&local_3b0);
          originalText_22.content.size_ = 0x22;
          originalText_22.content.ptr = "https://bad_domain.capnproto.org/";
          expectedRestringified_22.content.size_ = 1;
          expectedRestringified_22.content.ptr = "";
          parseAndCheck(&local_490,originalText_22,expectedRestringified_22,(Options)0x1);
          Url::~Url(&local_490);
          originalText_23.content.size_ = 0x2b;
          originalText_23.content.ptr = "https://foo%25bar:baz%25qux@capnproto.org/";
          expectedRestringified_23.content.size_ = 1;
          expectedRestringified_23.content.ptr = "";
          parseAndCheck(&local_570,originalText_23,expectedRestringified_23,(Options)0x1);
          Url::~Url(&local_570);
          originalText_24.content.size_ = 0x20;
          originalText_24.content.ptr = "https://capnproto.org/foo%25bar";
          expectedRestringified_24.content.size_ = 1;
          expectedRestringified_24.content.ptr = "";
          parseAndCheck(&local_650,originalText_24,expectedRestringified_24,(Options)0x1);
          Url::~Url(&local_650);
          originalText_25.content.size_ = 0x2b;
          originalText_25.content.ptr = "https://capnproto.org/?foo%25bar=baz%25qux";
          expectedRestringified_25.content.size_ = 1;
          expectedRestringified_25.content.ptr = "";
          parseAndCheck(&local_730,originalText_25,expectedRestringified_25,(Options)0x1);
          Url::~Url(&local_730);
          originalText_26.content.size_ = 0x21;
          originalText_26.content.ptr = "https://capnproto.org/#foo%25bar";
          expectedRestringified_26.content.size_ = 1;
          expectedRestringified_26.content.ptr = "";
          parseAndCheck(&local_810,originalText_26,expectedRestringified_26,(Options)0x1);
          Url::~Url(&local_810);
          originalText_27.content.size_ = 0x3a;
          originalText_27.content.ptr = "https://capnproto.org/foo//bar///test//?foo=bar&&baz=qux&";
          expectedRestringified_27.content.size_ = 1;
          expectedRestringified_27.content.ptr = "";
          parseAndCheck(&local_8f0,originalText_27,expectedRestringified_27,(Options)0x101);
          Url::~Url(&local_8f0);
          originalText_28.content.size_ = 0x24;
          originalText_28.content.ptr = "https://capnproto.org/foo//../bar/.";
          expectedRestringified_28.content.size_ = 0x1f;
          expectedRestringified_28.content.ptr = "https://capnproto.org/foo/bar/";
          parseAndCheck(&local_9d0,originalText_28,expectedRestringified_28,(Options)0x101);
          Url::~Url(&local_9d0);
          originalText_29.content.size_ = 0xd;
          originalText_29.content.ptr = "https://foo/";
          expectedRestringified_29.content.size_ = 1;
          expectedRestringified_29.content.ptr = "";
          parseAndCheck(&url,originalText_29,expectedRestringified_29,(Options)0x101);
          if (url.path.builder.pos != url.path.builder.ptr && _::Debug::minSeverity < 3) {
            _::Debug::log<char_const(&)[38]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,300,ERROR,"\"failed: expected \" \"url.path.size() == 0\"",
                       (char (*) [38])"failed: expected url.path.size() == 0");
          }
          if ((url.hasTrailingSlash == false) && (_::Debug::minSeverity < 3)) {
            _::Debug::log<char_const(&)[38]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0x12d,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
                       (char (*) [38])"failed: expected url.hasTrailingSlash");
          }
          Url::~Url(&url);
          originalText_30.content.size_ = 0x11;
          originalText_30.content.ptr = "https://foo/bar/";
          expectedRestringified_30.content.size_ = 1;
          expectedRestringified_30.content.ptr = "";
          parseAndCheck(&url,originalText_30,expectedRestringified_30,(Options)0x101);
          if ((long)url.path.builder.pos - (long)url.path.builder.ptr != 0x18 &&
              _::Debug::minSeverity < 3) {
            _::Debug::log<char_const(&)[38]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0x132,ERROR,"\"failed: expected \" \"url.path.size() == 1\"",
                       (char (*) [38])"failed: expected url.path.size() == 1");
          }
          if ((url.hasTrailingSlash == false) && (_::Debug::minSeverity < 3)) {
            _::Debug::log<char_const(&)[38]>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                       ,0x133,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
                       (char (*) [38])"failed: expected url.hasTrailingSlash");
          }
          Url::~Url(&url);
          return;
        }
        _::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                   ,0xf9,FAILED,"user.password != nullptr","");
        _::Debug::Fault::fatal(&f);
      }
      _::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xf7,FAILED,"url.userInfo != nullptr","");
      _::Debug::Fault::fatal(&f);
    }
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xd9,FAILED,"url.fragment != nullptr","");
    _::Debug::Fault::fatal(&f);
  }
  _::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
             ,0xa3,FAILED,"url.fragment != nullptr","");
  _::Debug::Fault::fatal(&f);
}

Assistant:

TEST(AsyncIo, SimpleNetwork) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();

  Own<ConnectionReceiver> listener;
  Own<AsyncIoStream> server;
  Own<AsyncIoStream> client;

  char receiveBuffer[4];

  auto port = newPromiseAndFulfiller<uint>();

  port.promise.then([&](uint portnum) {
    return network.parseAddress("localhost", portnum);
  }).then([&](Own<NetworkAddress>&& result) {
    return result->connect();
  }).then([&](Own<AsyncIoStream>&& result) {
    client = kj::mv(result);
    return client->write("foo", 3);
  }).detach([](kj::Exception&& exception) {
    KJ_FAIL_EXPECT(exception);
  });

  kj::String result = network.parseAddress("*").then([&](Own<NetworkAddress>&& result) {
    listener = result->listen();
    port.fulfiller->fulfill(listener->getPort());
    return listener->accept();
  }).then([&](Own<AsyncIoStream>&& result) {
    server = kj::mv(result);
    return server->tryRead(receiveBuffer, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer, n);
  }).wait(ioContext.waitScope);

  EXPECT_EQ("foo", result);
}